

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void MirrorPlane(uint8_t *src_y,int src_stride_y,uint8_t *dst_y,int dst_stride_y,int width,
                int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *MirrorRow;
  int y;
  code *pcVar2;
  int local_28;
  int local_24;
  long local_18;
  int local_c;
  long local_8;
  
  pcVar2 = MirrorRow_C;
  local_24 = in_R9D;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (in_R9D < 0) {
    local_24 = -in_R9D;
    local_8 = in_RDI + (local_24 + -1) * in_ESI;
    local_c = -in_ESI;
  }
  iVar1 = libyuv::TestCpuFlag(0);
  if ((iVar1 != 0) && (pcVar2 = MirrorRow_Any_SSSE3, (in_R8D & 0xf) == 0)) {
    pcVar2 = MirrorRow_SSSE3;
  }
  iVar1 = libyuv::TestCpuFlag(0);
  if ((iVar1 != 0) && (pcVar2 = MirrorRow_Any_AVX2, (in_R8D & 0x1f) == 0)) {
    pcVar2 = MirrorRow_AVX2;
  }
  local_18 = in_RDX;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    (*pcVar2)(local_8,local_18,in_R8D);
    local_8 = local_8 + local_c;
    local_18 = local_18 + in_ECX;
  }
  return;
}

Assistant:

LIBYUV_API
void MirrorPlane(const uint8_t* src_y,
                 int src_stride_y,
                 uint8_t* dst_y,
                 int dst_stride_y,
                 int width,
                 int height) {
  int y;
  void (*MirrorRow)(const uint8_t* src, uint8_t* dst, int width) = MirrorRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }
#if defined(HAS_MIRRORROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    MirrorRow = MirrorRow_Any_NEON;
    if (IS_ALIGNED(width, 32)) {
      MirrorRow = MirrorRow_NEON;
    }
  }
#endif
#if defined(HAS_MIRRORROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    MirrorRow = MirrorRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      MirrorRow = MirrorRow_SSSE3;
    }
  }
#endif
#if defined(HAS_MIRRORROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    MirrorRow = MirrorRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      MirrorRow = MirrorRow_AVX2;
    }
  }
#endif
#if defined(HAS_MIRRORROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    MirrorRow = MirrorRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      MirrorRow = MirrorRow_MMI;
    }
  }
#endif
#if defined(HAS_MIRRORROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    MirrorRow = MirrorRow_Any_MSA;
    if (IS_ALIGNED(width, 64)) {
      MirrorRow = MirrorRow_MSA;
    }
  }
#endif

  // Mirror plane
  for (y = 0; y < height; ++y) {
    MirrorRow(src_y, dst_y, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}